

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,float value)

{
  string local_38;
  float local_14;
  string *psStack_10;
  float value_local;
  
  local_14 = value;
  psStack_10 = __return_storage_ptr__;
  fpToString<float>(&local_38,value,5);
  std::operator+(__return_storage_ptr__,&local_38,"f");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( const float value ) {
    return fpToString( value, 5 ) + "f";
}